

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::IncrementRecursionDepth
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,StringPiece type_name,
          StringPiece field_name)

{
  int iVar1;
  stringpiece_ssize_type sVar2;
  StringPiece error_message;
  AlphaNum *in_stack_fffffffffffffec8;
  char *local_130;
  undefined8 local_128;
  AlphaNum local_100;
  AlphaNum local_d0;
  AlphaNum local_a0;
  AlphaNum local_70;
  string local_40;
  
  local_a0.piece_size_ = field_name.length_;
  local_a0.piece_data_ = field_name.ptr_;
  local_100.piece_size_ = type_name.length_;
  local_100.piece_data_ = type_name.ptr_;
  iVar1 = this->recursion_depth_;
  this->recursion_depth_ = iVar1 + 1;
  if (iVar1 < this->max_recursion_depth_) {
    Status::Status(__return_storage_ptr__);
  }
  else {
    local_130 = "Message too deep. Max recursion depth reached for type \'";
    local_128 = 0x38;
    local_d0.piece_data_ = "\', field \'";
    local_d0.piece_size_ = 10;
    local_70.piece_data_ = "\'";
    local_70.piece_size_ = 1;
    StrCat_abi_cxx11_(&local_40,(protobuf *)&local_130,&local_100,&local_d0,&local_a0,&local_70,
                      in_stack_fffffffffffffec8);
    sVar2 = StringPiece::CheckedSsizeTFromSizeT(local_40._M_string_length);
    error_message.length_ = sVar2;
    error_message.ptr_ = local_40._M_dataplus._M_p;
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,error_message);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::IncrementRecursionDepth(
    StringPiece type_name, StringPiece field_name) const {
  if (++recursion_depth_ > max_recursion_depth_) {
    return Status(
        util::error::INVALID_ARGUMENT,
        StrCat("Message too deep. Max recursion depth reached for type '",
                     type_name, "', field '", field_name, "'"));
  }
  return util::Status();
}